

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O0

void __thiscall vmbt_isaac_ifc::seed_str(vmbt_isaac_ifc *this,char *str,size_t len)

{
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  int in_stack_0000000c;
  undefined8 local_18;
  
  local_18 = in_RDX;
  if (0x400 < in_RDX) {
    local_18 = 0x400;
  }
  memset((void *)(*(long *)(in_RDI + 8) + 4),0,0x400);
  memcpy((void *)(*(long *)(in_RDI + 8) + 4),in_RSI,local_18);
  isaac_init((isaacctx *)len,in_stack_0000000c);
  return;
}

Assistant:

virtual void seed_str(const char *str, size_t len)
    {
        /* 
         *   Copy the string value into the rsl array; copy as much as will
         *   fit, and zero the rest.  (The point here is to be deterministic,
         *   so we want this to be the same every time with a given seed - we
         *   don't want to include random data left behind from previous
         *   iterations.)
         */
        if (len > sizeof(ctx->rsl))
            len = sizeof(ctx->rsl);

        memset(ctx->rsl, 0, sizeof(ctx->rsl));
        memcpy(ctx->rsl, str, len);

        /* initialize with the rsl data */
        isaac_init(ctx, TRUE);
    }